

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::initialize
          (basic_csv_parser<char,_std::allocator<char>_> *this)

{
  vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *this_00;
  csv_mode in_EAX;
  csv_mode *pcVar1;
  csv_mode cVar2;
  iterator iVar3;
  undefined8 local_18;
  
  this_00 = &this->stack_;
  local_18._0_4_ = in_EAX;
  std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::reserve(this_00,3)
  ;
  local_18 = (ulong)(csv_mode)local_18;
  iVar3._M_current =
       (this->stack_).
       super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl
       .super__Vector_impl_data._M_finish;
  pcVar1 = (this->stack_).
           super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == pcVar1) {
    std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
    _M_realloc_insert<jsoncons::csv::csv_mode>(this_00,iVar3,(csv_mode *)((long)&local_18 + 4));
    iVar3._M_current =
         (this->stack_).
         super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pcVar1 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = initial;
    iVar3._M_current = iVar3._M_current + 1;
    (this->stack_).
    super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  cVar2 = (this->header_lines_ == 0) + header;
  local_18 = CONCAT44(local_18._4_4_,cVar2);
  if (iVar3._M_current == pcVar1) {
    std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
    _M_realloc_insert<jsoncons::csv::csv_mode>(this_00,iVar3,(csv_mode *)&local_18);
  }
  else {
    *iVar3._M_current = cVar2;
    (this->stack_).
    super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  return;
}

Assistant:

void initialize()
    {
        stack_.reserve(default_depth);
        stack_.push_back(csv_mode::initial);
        stack_.push_back((header_lines_ > 0) ? csv_mode::header : csv_mode::data);
    }